

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acm.cpp
# Opt level: O2

void __thiscall intel_acm_t::header_t::~header_t(header_t *this)

{
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__header_t_00181c00;
  std::__cxx11::string::~string((string *)&this->m_scratch_space);
  std::__cxx11::string::~string((string *)&this->m_rsa_signature);
  std::__cxx11::string::~string((string *)&this->m_rsa_public_key);
  std::__cxx11::string::~string((string *)&this->m_reserved);
  return;
}

Assistant:

intel_acm_t::header_t::~header_t() {
    _clean_up();
}